

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

bool BicTest3<Blob<128>,Blob<128>>(pfHash hash,int reps,bool verbose)

{
  long lVar1;
  ulong uVar2;
  int *piVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  void *__s;
  ulong uVar6;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined8 in_XMM7_Qb;
  Blob<128> h2;
  Blob<128> h1;
  Blob<128> d;
  Blob<128> key;
  uint local_c8;
  uint local_c4;
  void *local_b0;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Rand local_48;
  
  local_48.x = 0x88e23b73;
  local_48.y = 0x11310f6c;
  local_48.z = 0x18847f4;
  local_48.w = 0x1142a2ba;
  local_58 = 0;
  uStack_50 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  __s = operator_new(0x2000000);
  lVar12 = 0;
  memset(__s,0,0x2000000);
  local_b0 = (void *)((long)__s + 0x10);
  do {
    if ((byte)((byte)((char)lVar12 * -0x55) >> 2 | (char)lVar12 * -0x40) < 0x16) {
      putchar(0x2e);
    }
    if (0 < reps) {
      local_c4 = 0;
      do {
        Rand::rand_p(&local_48,&local_58,0x10);
        (*hash)(&local_58,0x10,0,&local_78);
        flipbit(&local_58,0x10,(uint32_t)lVar12);
        (*hash)(&local_58,0x10,0,&local_88);
        lVar10 = -0x7f;
        local_68 = local_88 ^ local_78;
        uStack_60 = uStack_80 ^ uStack_70;
        pvVar7 = local_b0;
        lVar14 = 0;
        do {
          lVar1 = lVar14 + 1;
          lVar11 = lVar10;
          lVar15 = (long)pvVar7;
          do {
            uVar4 = getbit(&local_68,0x10,(uint32_t)lVar14);
            uVar5 = getbit(&local_68,0x10,(int)lVar11 + 0x80);
            piVar3 = (int *)(lVar15 + (ulong)(uVar5 * 2 | uVar4) * 4);
            *piVar3 = *piVar3 + 1;
            lVar15 = lVar15 + 0x10;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0);
          pvVar7 = (void *)((long)pvVar7 + 0x810);
          lVar10 = lVar10 + 1;
          lVar14 = lVar1;
        } while (lVar1 != 0x7f);
        local_c4 = local_c4 + 1;
      } while (local_c4 != reps);
    }
    local_b0 = (void *)((long)local_b0 + 0x40000);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x80);
  putchar(10);
  auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar16 = 1;
  uVar13 = 0;
  local_c8 = 0;
  local_c4 = 0;
  auVar19 = ZEXT864(0) << 0x40;
  uVar6 = 0;
  local_b0 = __s;
LAB_00132d8f:
  uVar2 = uVar6 + 1;
  uVar17 = uVar16;
LAB_00132d9d:
  if (verbose) {
    printf("(%3d,%3d) - ",uVar6 & 0xffffffff,uVar17 & 0xffffffff);
    auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar19 = ZEXT864(auVar19._0_8_);
  }
  uVar9 = 0;
LAB_00132dee:
  do {
    auVar22 = ZEXT864(0) << 0x40;
    lVar12 = 0;
    do {
      lVar14 = lVar12 * 4;
      lVar12 = lVar12 + 1;
      auVar20._0_8_ =
           (double)*(int *)((long)local_b0 + lVar14 + uVar9 * 0x40000 + uVar17 * 0x10) /
           (double)(reps / 2);
      auVar20._8_8_ = in_XMM7_Qb;
      auVar20 = vfmadd213sd_fma(auVar20,auVar23._0_16_,auVar24._0_16_);
      auVar20 = vandpd_avx(auVar20,auVar25._0_16_);
      auVar20 = vmaxsd_avx(auVar20,auVar22._0_16_);
      auVar22 = ZEXT1664(auVar20);
    } while (lVar12 != 4);
    dVar21 = auVar20._0_8_;
    if (auVar19._0_8_ < dVar21) {
      uVar13 = uVar9 & 0xffffffff;
      auVar19 = ZEXT1664(auVar20);
      local_c8 = (uint)uVar6;
      local_c4 = (uint)uVar17;
    }
    if (!verbose) goto LAB_00132eb3;
    iVar8 = 0x2e;
    uVar18 = auVar19._0_8_;
    if ((0.01 <= dVar21) && (iVar8 = 0x6f, 0.05 <= dVar21)) {
      iVar8 = (uint)(0.33 <= dVar21) * 9 + 0x4f;
    }
    putchar(iVar8);
    auVar19 = ZEXT864(uVar18);
    auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x80);
  if (verbose) {
    putchar(10);
    auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
    auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
    auVar19 = ZEXT864(uVar18);
    uVar17 = uVar17 + 1;
    if (uVar17 == 0x80) {
      iVar8 = 0x8c;
      do {
        putchar(0x2d);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      putchar(10);
      auVar19 = ZEXT864(uVar18);
      auVar23 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar24 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar25 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      goto LAB_00132f5d;
    }
    goto LAB_00132d9d;
  }
  goto LAB_00132f0a;
LAB_00132eb3:
  uVar9 = uVar9 + 1;
  if (uVar9 == 0x80) goto LAB_00132f0a;
  goto LAB_00132dee;
LAB_00132f0a:
  uVar17 = uVar17 + 1;
  if (uVar17 == 0x80) goto LAB_00132f5d;
  goto LAB_00132d9d;
LAB_00132f5d:
  local_b0 = (void *)((long)local_b0 + 0x800);
  uVar16 = uVar16 + 1;
  uVar6 = uVar2;
  if (uVar2 == 0x7f) {
    printf("Max bias %f - (%3d : %3d,%3d)\n",uVar13,(ulong)local_c8,(ulong)local_c4);
    operator_delete(__s);
    return auVar19._0_8_ < 0.05;
  }
  goto LAB_00132d8f;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}